

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_MPEG2.cpp
# Opt level: O1

ostream * ASDCP::MPEG2::operator<<(ostream *strm,VideoDescriptor *VDesc)

{
  ostream *poVar1;
  long *plVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(strm,"        SampleRate: ",0x14);
  poVar1 = (ostream *)std::ostream::operator<<(strm,(VDesc->SampleRate).Numerator);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/",1);
  plVar2 = (long *)std::ostream::operator<<(poVar1,(VDesc->SampleRate).Denominator);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"       FrameLayout: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"       StoredWidth: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"      StoredHeight: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"       AspectRatio: ",0x14);
  poVar1 = (ostream *)std::ostream::operator<<(strm,(VDesc->AspectRatio).Numerator);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/",1);
  plVar2 = (long *)std::ostream::operator<<(poVar1,(VDesc->AspectRatio).Denominator);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"    ComponentDepth: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm," HorizontalSubsmpl: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"   VerticalSubsmpl: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"       ColorSiting: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"  CodedContentType: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"          LowDelay: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"           BitRate: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"   ProfileAndLevel: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm," ContainerDuration: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return strm;
}

Assistant:

std::ostream&
ASDCP::MPEG2::operator << (std::ostream& strm, const VideoDescriptor& VDesc)
{
  strm << "        SampleRate: " << VDesc.SampleRate.Numerator << "/" << VDesc.SampleRate.Denominator << std::endl;
  strm << "       FrameLayout: " << (unsigned) VDesc.FrameLayout << std::endl;
  strm << "       StoredWidth: " << (unsigned) VDesc.StoredWidth << std::endl;
  strm << "      StoredHeight: " << (unsigned) VDesc.StoredHeight << std::endl;
  strm << "       AspectRatio: " << VDesc.AspectRatio.Numerator << "/" << VDesc.AspectRatio.Denominator << std::endl;
  strm << "    ComponentDepth: " << (unsigned) VDesc.ComponentDepth << std::endl;
  strm << " HorizontalSubsmpl: " << (unsigned) VDesc.HorizontalSubsampling << std::endl;
  strm << "   VerticalSubsmpl: " << (unsigned) VDesc.VerticalSubsampling << std::endl;
  strm << "       ColorSiting: " << (unsigned) VDesc.ColorSiting << std::endl;
  strm << "  CodedContentType: " << (unsigned) VDesc.CodedContentType << std::endl;
  strm << "          LowDelay: " << (unsigned) VDesc.LowDelay << std::endl;
  strm << "           BitRate: " << (unsigned) VDesc.BitRate << std::endl;
  strm << "   ProfileAndLevel: " << (unsigned) VDesc.ProfileAndLevel << std::endl;
  strm << " ContainerDuration: " << (unsigned) VDesc.ContainerDuration << std::endl;

  return strm;
}